

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O2

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::AddKel
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  double *pdVar1;
  long lVar2;
  complex<double> *pcVar3;
  complex<double> *pcVar4;
  double dVar5;
  bool bVar6;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  long *plVar11;
  long lVar12;
  TPZFMatrix<std::complex<double>_> *pTVar13;
  long lVar14;
  long lVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  double dVar16;
  complex<double> a;
  
  lVar10 = (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  lVar9 = 0;
  lVar14 = 0;
  do {
    if (lVar10 <= lVar14) {
      return;
    }
    for (lVar15 = 0; lVar15 < lVar10; lVar15 = lVar15 + 1) {
      lVar10 = destinationindex->fStore[lVar14];
      lVar2 = destinationindex->fStore[lVar15];
      lVar12 = lVar14;
      pTVar13 = elmat;
      (*(elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(elmat,lVar14,lVar15);
      a._M_value._8_8_ = lVar12;
      a._M_value._0_8_ = pTVar13;
      dVar16 = in_XMM1_Qa;
      bVar6 = IsZero(a);
      if (!bVar6) {
        lVar12 = lVar9 + 1;
        plVar11 = (this->fIA).fStore;
        lVar7 = plVar11[lVar10];
        lVar10 = plVar11[lVar10 + 1];
        if (lVar12 < lVar7) {
          plVar11 = (this->fJA).fStore;
        }
        else {
          plVar11 = (this->fJA).fStore;
          if ((lVar12 < lVar10) && (plVar11[lVar9 + 1] == lVar2)) {
            pcVar3 = (this->fA).fStore;
            pcVar4 = pcVar3 + lVar12;
            dVar5 = *(double *)(pcVar4->_M_value + 8);
            dVar16 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) +
                     *(double *)pcVar4->_M_value;
            pcVar3 = pcVar3 + lVar12;
            *(double *)pcVar3->_M_value = dVar16;
            *(double *)(pcVar3->_M_value + 8) = in_XMM1_Qa + dVar5;
            lVar9 = lVar12;
            goto LAB_00dcf1aa;
          }
        }
        lVar9 = lVar10;
        if (lVar10 < lVar7) {
          lVar9 = lVar7;
        }
        lVar12 = lVar7 << 4;
        for (; lVar7 < lVar10; lVar7 = lVar7 + 1) {
          if (plVar11[lVar7] == lVar2) {
            if (lVar2 == -1) {
LAB_00dcf187:
              plVar11[lVar7] = lVar2;
              pcVar4 = (this->fA).fStore;
              *(ulong *)(pcVar4->_M_value + lVar12) = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
              *(double *)(pcVar4->_M_value + lVar12 + 8) = in_XMM1_Qa;
              lVar9 = lVar7;
            }
            else {
              pcVar4 = (this->fA).fStore;
              pdVar1 = (double *)(pcVar4->_M_value + lVar12);
              dVar5 = pdVar1[1];
              dVar16 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) + *pdVar1;
              pdVar1 = (double *)(pcVar4->_M_value + lVar12);
              *pdVar1 = dVar16;
              pdVar1[1] = in_XMM1_Qa + dVar5;
              lVar9 = lVar7;
            }
            goto LAB_00dcf1aa;
          }
          if (plVar11[lVar7] == -1) goto LAB_00dcf187;
          lVar12 = lVar12 + 0x10;
        }
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line ="
                                );
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        poVar8 = std::operator<<(poVar8," column =");
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
LAB_00dcf1aa:
      lVar10 = (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
      in_XMM1_Qa = dVar16;
    }
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

void TPZFYsmpMatrix<TVar>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec<int64_t> & destinationindex){
    int64_t i,j,k = 0;
    TVar value=0.;
    int64_t ipos,jpos;
    for(i=0;i<elmat.Rows();i++){
        for(j=0;j<elmat.Rows();j++){
            ipos=destinationindex[i];
            jpos=destinationindex[j];
            value=elmat.GetVal(i,j);
            //cout << "j= " << j << endl;
            if(!IsZero(value)){
                //cout << "fIA[ipos] " << fIA[ipos] << "     fIA[ipos+1] " << fIA[ipos+1] << endl;
                int flag = 0;
				k++;
				if(k >= fIA[ipos] && k < fIA[ipos+1] && fJA[k]==jpos)
				{ // OK -> elements in sequence
					fA[k]+=value;
					flag = 1;
				}else
				{
					for(k=fIA[ipos];k<fIA[ipos+1];k++){
						if(fJA[k]==jpos || fJA[k]==-1){
							//cout << "fJA[k] " << fJA[k] << " jpos "<< jpos << "   " << value << endl;
							//cout << "k " << k << "   "<< jpos << "   " << value << endl;
							flag=1;
							if(fJA[k]==-1){
								fJA[k]=jpos;
								fA[k]=value;
								// cout << jpos << "   " << value << endl;
								break;
							}else{
								fA[k]+=value;
								break;
							}
						}
					}
				}
                if(!flag) cout << "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line =" << ipos << " column =" << jpos << endl;         }
        }
    }
}